

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft_reaper.cc
# Opt level: O2

bool __thiscall sptk::reaper::FFT::flog_mag(FFT *this,float *x,float *y,float *z,int n)

{
  long lVar1;
  float fVar2;
  float fVar3;
  
  if ((n != 0 && z != (float *)0x0) && (y != (float *)0x0 && x != (float *)0x0)) {
    for (lVar1 = (long)n << 2; z < (float *)((long)z + lVar1); lVar1 = lVar1 + -4) {
      fVar2 = *(float *)((long)x + lVar1 + -4);
      fVar3 = *(float *)((long)y + lVar1 + -4);
      fVar2 = fVar2 * fVar2 + fVar3 * fVar3;
      fVar3 = -200.0;
      if (0.0 < fVar2) {
        fVar3 = log10f(fVar2);
        fVar3 = fVar3 * 10.0;
      }
      *(float *)((long)z + lVar1 + -4) = fVar3;
    }
  }
  return (n != 0 && z != (float *)0x0) && (y != (float *)0x0 && x != (float *)0x0);
}

Assistant:

bool FFT::flog_mag(float *x, float *y, float *z, int n) {
  float *xp, *yp, *zp, t1, t2, ssq;

  if (x && y && z && n) {
    for (xp = x + n, yp = y + n, zp = z + n; zp > z;) {
      t1 = *--xp;
      t2 = *--yp;
      ssq = (t1 * t1) + (t2 * t2);
      *--zp = (ssq > 0.0)? 10.0 * log10(ssq) : -200.0;
    }
    return true;
  } else {
    return false;
  }
}